

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableRemove(ImGuiTable *table)

{
  ImGuiContext *pIVar1;
  int idx;
  
  pIVar1 = GImGui;
  idx = (int)((long)table - (long)(GImGui->Tables).Buf.Data >> 4) * -0x6eb3e453;
  ImPool<ImGuiTable>::Remove(&GImGui->Tables,table->ID,idx);
  (pIVar1->TablesLastTimeActive).Data[idx] = -1.0;
  return;
}

Assistant:

void ImGui::TableRemove(ImGuiTable* table)
{
    //IMGUI_DEBUG_PRINT("TableRemove() id=0x%08X\n", table->ID);
    ImGuiContext& g = *GImGui;
    int table_idx = g.Tables.GetIndex(table);
    //memset(table->RawData.Data, 0, table->RawData.size_in_bytes());
    //memset(table, 0, sizeof(ImGuiTable));
    g.Tables.Remove(table->ID, table);
    g.TablesLastTimeActive[table_idx] = -1.0f;
}